

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

void __thiscall
slang::SourceManager::addDiagnosticDirective
          (SourceManager *this,SourceLocation location,string_view name,DiagnosticSeverity severity)

{
  vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
  *this_00;
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  pointer pDVar5;
  int iVar6;
  SourceLocation SVar7;
  borrowed_iterator_t<std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_&> __position;
  ulong pos0;
  ulong uVar8;
  uint uVar9;
  ulong hash;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  byte bVar16;
  undefined1 auVar17 [16];
  try_emplace_args_t local_99;
  BufferID local_98;
  DiagnosticSeverity severity_local;
  size_t offset;
  flat_hash_map<BufferID,_std::vector<DiagnosticDirectiveInfo>_> *local_88;
  string_view name_local;
  unique_lock<std::shared_mutex> lock;
  locator local_60;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  severity_local = severity;
  std::unique_lock<std::shared_mutex>::unique_lock(&lock,&this->mutex);
  SVar7 = getFullyExpandedLocImpl<std::unique_lock<std::shared_mutex>_>(this,location,&lock);
  uVar8 = (ulong)SVar7 >> 0x1c;
  local_98.id = SVar7._0_4_ & 0xfffffff;
  local_88 = &this->diagDirectives;
  hash = SUB168(ZEXT416(local_98.id) * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(ZEXT416(local_98.id) * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->diagDirectives).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar3 = (this->diagDirectives).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
           .arrays.elements_;
  uVar4 = (this->diagDirectives).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
          .arrays.groups_size_mask;
  uVar10 = 0;
  uVar12 = pos0;
  do {
    pgVar1 = (this->diagDirectives).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
             .arrays.groups_ + uVar12;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bStack_39 = pgVar1->m[0xf].n;
    uVar13 = (uchar)uVar2;
    auVar17[0] = -(local_48 == uVar13);
    uVar14 = (uchar)((uint)uVar2 >> 8);
    auVar17[1] = -(uStack_47 == uVar14);
    uVar15 = (uchar)((uint)uVar2 >> 0x10);
    auVar17[2] = -(uStack_46 == uVar15);
    bVar16 = (byte)((uint)uVar2 >> 0x18);
    auVar17[3] = -(bStack_45 == bVar16);
    auVar17[4] = -(uStack_44 == uVar13);
    auVar17[5] = -(uStack_43 == uVar14);
    auVar17[6] = -(uStack_42 == uVar15);
    auVar17[7] = -(bStack_41 == bVar16);
    auVar17[8] = -(uStack_40 == uVar13);
    auVar17[9] = -(uStack_3f == uVar14);
    auVar17[10] = -(uStack_3e == uVar15);
    auVar17[0xb] = -(bStack_3d == bVar16);
    auVar17[0xc] = -(uStack_3c == uVar13);
    auVar17[0xd] = -(uStack_3b == uVar14);
    auVar17[0xe] = -(uStack_3a == uVar15);
    auVar17[0xf] = -(bStack_39 == bVar16);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); offset = uVar8,
        uVar9 != 0; uVar9 = uVar9 - 1 & uVar9) {
      iVar6 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (local_98.id == *(uint *)((long)&ppVar3[uVar12 * 0xf].first.id + (ulong)(uint)(iVar6 << 5))
         ) {
        local_60.p = (pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>
                      *)((long)&ppVar3[uVar12 * 0xf].first.id + (ulong)(uint)(iVar6 << 5));
        goto LAB_00605497;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0) break;
    lVar11 = uVar12 + uVar10;
    uVar10 = uVar10 + 1;
    uVar12 = lVar11 + 1U & uVar4;
  } while (uVar10 <= uVar4);
  if ((this->diagDirectives).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
      .size_ctrl.size <
      (this->diagDirectives).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
    ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID>
              (&local_60,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
                *)local_88,pos0,hash,&local_99,&local_98);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::BufferID>
              (&local_60,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>>>>
                *)local_88,hash,&local_99,&local_98);
  }
LAB_00605497:
  this_00 = &(local_60.p)->second;
  pDVar5 = ((local_60.p)->second).
           super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((local_60.p)->second).
       super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
       ._M_impl.super__Vector_impl_data._M_start == pDVar5) || (pDVar5[-1].offset <= uVar8)) {
    std::
    vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
    ::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
              ((vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
                *)this_00,&name_local,&offset,&severity_local);
  }
  else {
    __position = std::ranges::__upper_bound_fn::
                 operator()<std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_&,_unsigned_long,_unsigned_long_slang::SourceManager::DiagnosticDirectiveInfo::*,_std::ranges::less>
                           ((__upper_bound_fn *)&std::ranges::upper_bound,this_00,&offset,0x10);
    std::
    vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
    ::
    _M_emplace_aux<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&,slang::DiagnosticSeverity&>
              ((vector<slang::SourceManager::DiagnosticDirectiveInfo,std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>>
                *)this_00,(const_iterator)__position._M_current,&name_local,&offset,&severity_local)
    ;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void SourceManager::addDiagnosticDirective(SourceLocation location, std::string_view name,
                                           DiagnosticSeverity severity) {
    std::unique_lock<std::shared_mutex> lock(mutex);
    SourceLocation fileLocation = getFullyExpandedLocImpl(location, lock);

    size_t offset = fileLocation.offset();
    auto& vec = diagDirectives[fileLocation.buffer()];
    if (vec.empty() || offset >= vec.back().offset)
        vec.emplace_back(name, offset, severity);
    else {
        // Keep the list in sorted order. Typically new additions should be at the end,
        // in which case we'll hit the condition above, but just in case we will do the
        // full search and insert here.
        vec.emplace(std::ranges::upper_bound(vec, offset, {}, &DiagnosticDirectiveInfo::offset),
                    name, offset, severity);
    }
}